

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O1

bool peparse::getResources
               (bounded_buffer *b,bounded_buffer *fileBegin,
               vector<peparse::section,_std::allocator<peparse::section>_> *secs,
               vector<peparse::resource,_std::allocator<peparse::resource>_> *rsrcs)

{
  pointer psVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  pointer psVar5;
  char cVar6;
  section s;
  long *local_88 [2];
  long local_78 [2];
  uint64_t local_68;
  bounded_buffer *pbStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if (b == (bounded_buffer *)0x0) {
    bVar3 = false;
  }
  else {
    psVar5 = (secs->super__Vector_base<peparse::section,_std::allocator<peparse::section>_>)._M_impl
             .super__Vector_impl_data._M_start;
    psVar1 = (secs->super__Vector_base<peparse::section,_std::allocator<peparse::section>_>)._M_impl
             .super__Vector_impl_data._M_finish;
    if (psVar5 == psVar1) {
      bVar3 = true;
    }
    else {
      do {
        pcVar2 = (psVar5->sectionName)._M_dataplus._M_p;
        local_88[0] = local_78;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_88,pcVar2,pcVar2 + (psVar5->sectionName)._M_string_length);
        local_38._0_2_ = (psVar5->sec).NumberOfRelocations;
        local_38._2_2_ = (psVar5->sec).NumberOfLinenumbers;
        local_38._4_4_ = (psVar5->sec).Characteristics;
        local_68 = psVar5->sectionBase;
        pbStack_60 = psVar5->sectionData;
        local_58 = *(undefined8 *)(psVar5->sec).Name;
        uStack_50._0_4_ = (psVar5->sec).Misc;
        uStack_50._4_4_ = (psVar5->sec).VirtualAddress;
        local_48._0_4_ = (psVar5->sec).SizeOfRawData;
        local_48._4_4_ = (psVar5->sec).PointerToRawData;
        uStack_40._0_4_ = (psVar5->sec).PointerToRelocations;
        uStack_40._4_4_ = (psVar5->sec).PointerToLinenumbers;
        iVar4 = std::__cxx11::string::compare((char *)local_88);
        cVar6 = '\x03';
        if (iVar4 == 0) {
          bVar3 = parse_resource_table
                            (pbStack_60,0,uStack_50._4_4_,0,(resource_dir_entry *)0x0,rsrcs);
          cVar6 = bVar3 + '\x01';
        }
        if (local_88[0] != local_78) {
          operator_delete(local_88[0],local_78[0] + 1);
        }
        if (iVar4 == 0) goto LAB_00111146;
        psVar5 = psVar5 + 1;
      } while (psVar5 != psVar1);
      cVar6 = '\x02';
LAB_00111146:
      bVar3 = cVar6 == '\x02';
    }
  }
  return bVar3;
}

Assistant:

bool getResources(bounded_buffer *b,
                  bounded_buffer *fileBegin,
                  const std::vector<section> secs,
                  std::vector<resource> &rsrcs) {
  static_cast<void>(fileBegin);

  if (b == nullptr)
    return false;

  for (section s : secs) {
    if (s.sectionName != ".rsrc") {
      continue;
    }

    if (!parse_resource_table(
            s.sectionData, 0, s.sec.VirtualAddress, 0, nullptr, rsrcs)) {
      return false;
    }

    break; // Because there should only be one .rsrc
  }

  return true;
}